

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool ClipperLib::IntersectPoint(TEdge *edge1,TEdge *edge2,IntPoint *ip,bool UseFullInt64Range)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  bVar3 = SlopesEqual(edge1,edge2,UseFullInt64Range);
  if (bVar3) {
    return false;
  }
  dVar8 = edge1->dx;
  if (1e-20 <= ABS(dVar8)) {
    dVar1 = edge2->dx;
    if (1e-20 <= ABS(dVar1)) {
      dVar7 = (double)edge1->xbot - (double)edge1->ybot * dVar8;
      dVar8 = (((double)edge2->xbot - (double)edge2->ybot * dVar1) - dVar7) / (dVar8 - dVar1);
      lVar5 = (long)((double)(~-(ulong)(dVar8 < 0.0) & 0x3fe0000000000000 |
                             -(ulong)(dVar8 < 0.0) & 0xbfe0000000000000) + dVar8);
      ip->Y = lVar5;
      dVar7 = dVar8 * edge1->dx + dVar7;
      uVar6 = -(ulong)(dVar7 < 0.0);
      ip->X = (long)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar7);
      goto LAB_00526795;
    }
    lVar4 = edge2->xbot;
    ip->X = lVar4;
    dVar8 = edge1->dx;
    lVar5 = edge1->ybot;
    if (1e-20 <= ABS(dVar8 + 1e+40)) {
      lVar2 = edge1->xbot;
      goto LAB_005266c2;
    }
  }
  else {
    lVar4 = edge1->xbot;
    ip->X = lVar4;
    dVar8 = edge2->dx;
    lVar5 = edge2->ybot;
    if (1e-20 <= ABS(dVar8 + 1e+40)) {
      lVar2 = edge2->xbot;
LAB_005266c2:
      dVar8 = (double)lVar4 / dVar8 + ((double)lVar5 - (double)lVar2 / dVar8);
      lVar5 = (long)(dVar8 + *(double *)(&DAT_005eda50 + (ulong)(dVar8 < 0.0) * 8));
    }
  }
  ip->Y = lVar5;
LAB_00526795:
  lVar4 = edge1->ytop;
  lVar2 = edge2->ytop;
  if (((lVar5 < lVar2 || lVar5 != lVar4) || (bVar3 = true, edge1->tmpX <= edge2->tmpX)) &&
     ((lVar5 < lVar4 || lVar5 != lVar2 || (bVar3 = true, edge1->tmpX <= edge2->tmpX)))) {
    bVar3 = lVar2 < lVar5 && lVar4 < lVar5;
  }
  return bVar3;
}

Assistant:

bool IntersectPoint(TEdge &edge1, TEdge &edge2,
  IntPoint &ip, bool UseFullInt64Range)
{
  double b1, b2;
  if (SlopesEqual(edge1, edge2, UseFullInt64Range)) return false;
  else if (NEAR_ZERO(edge1.dx))
  {
    ip.X = edge1.xbot;
    if (NEAR_EQUAL(edge2.dx, HORIZONTAL))
    {
      ip.Y = edge2.ybot;
    } else
    {
      b2 = edge2.ybot - (edge2.xbot/edge2.dx);
      ip.Y = Round(ip.X/edge2.dx + b2);
    }
  }
  else if (NEAR_ZERO(edge2.dx))
  {
    ip.X = edge2.xbot;
    if (NEAR_EQUAL(edge1.dx, HORIZONTAL))
    {
      ip.Y = edge1.ybot;
    } else
    {
      b1 = edge1.ybot - (edge1.xbot/edge1.dx);
      ip.Y = Round(ip.X/edge1.dx + b1);
    }
  } else
  {
    b1 = edge1.xbot - edge1.ybot * edge1.dx;
    b2 = edge2.xbot - edge2.ybot * edge2.dx;
    b2 = (b2-b1)/(edge1.dx - edge2.dx);
    ip.Y = Round(b2);
    ip.X = Round(edge1.dx * b2 + b1);
  }

  return
    //can be *so close* to the top of one edge that the rounded Y equals one ytop ...
    (ip.Y == edge1.ytop && ip.Y >= edge2.ytop && edge1.tmpX > edge2.tmpX) ||
    (ip.Y == edge2.ytop && ip.Y >= edge1.ytop && edge1.tmpX > edge2.tmpX) ||
    (ip.Y > edge1.ytop && ip.Y > edge2.ytop);
}